

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_metadata_array_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  class_interface pcVar1;
  long lVar2;
  atomic_uintmax_t aVar3;
  vector pvVar4;
  type_id tVar5;
  value pvVar6;
  klass in_RCX;
  function_conflict in_RDX;
  int type_id;
  scope_metadata_array_cb_iterator metadata_iterator;
  undefined4 in_stack_ffffffffffffffd0;
  
  tVar5 = value_type_id(in_RCX);
  if (tVar5 == 0xd) {
    value_to_function((value)CONCAT44(0xd,in_stack_ffffffffffffffd0));
    pvVar6 = function_metadata(in_RDX);
    pcVar1 = in_RCX->interface;
    in_RCX->interface = (class_interface)((long)&pcVar1->create + 1);
    *(value *)(in_RCX->name + (long)pcVar1 * 8) = pvVar6;
  }
  else if (tVar5 == 0xf) {
    value_to_class((value)CONCAT44(0xf,in_stack_ffffffffffffffd0));
    pvVar6 = class_metadata(in_RCX);
    lVar2 = *(long *)&in_RCX->accessor;
    aVar3 = (in_RCX->ref).count;
    (in_RCX->ref).count = aVar3 + 1;
    *(value *)(lVar2 + aVar3 * 8) = pvVar6;
  }
  else if (tVar5 == 0x10) {
    value_to_object((value)CONCAT44(0x10,in_stack_ffffffffffffffd0));
    pvVar6 = object_metadata((object)in_RCX);
    pvVar4 = in_RCX->constructors;
    in_RCX->constructors = pvVar4 + 1;
    *(value *)((long)in_RCX->impl + (long)pvVar4 * 8) = pvVar6;
  }
  return 0;
}

Assistant:

int scope_metadata_array_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	scope_metadata_array_cb_iterator metadata_iterator = (scope_metadata_array_cb_iterator)args;

	(void)s;
	(void)key;

	int type_id = value_type_id(val);

	if (type_id == TYPE_FUNCTION)
	{
		metadata_iterator->functions[metadata_iterator->functions_size++] = function_metadata(value_to_function(val));
	}
	else if (type_id == TYPE_CLASS)
	{
		metadata_iterator->classes[metadata_iterator->classes_size++] = class_metadata(value_to_class(val));
	}
	else if (type_id == TYPE_OBJECT)
	{
		metadata_iterator->objects[metadata_iterator->objects_size++] = object_metadata(value_to_object(val));
	}

	return 0;
}